

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONScanner.cpp
# Opt level: O0

void __thiscall
JSON::JSONScanner::Init
          (JSONScanner *this,char16 *input,uint len,Token *pOutToken,ScriptContext *sc,
          char16 *current,ArenaAllocator *allocator)

{
  char16 *current_local;
  ScriptContext *sc_local;
  Token *pOutToken_local;
  uint len_local;
  char16 *input_local;
  JSONScanner *this_local;
  
  this->inputText = input;
  this->currentChar = current;
  this->inputLen = len;
  this->pToken = pOutToken;
  this->scriptContext = sc;
  this->allocator = allocator;
  return;
}

Assistant:

void JSONScanner::Init(const char16* input, uint len, Token* pOutToken, Js::ScriptContext* sc, const char16* current, ArenaAllocator* allocator)
    {
        // Note that allocator could be nullptr from JSONParser, if we could not reuse an allocator, keep our own
        inputText = input;
        currentChar = current;
        inputLen = len;
        pToken = pOutToken;
        scriptContext = sc;
        this->allocator = allocator;
    }